

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

char * mg_next_comma_list_entry(char *list,mg_str *val,mg_str *eq_val)

{
  char *pcVar1;
  size_t sVar2;
  mg_str *eq_val_local;
  mg_str *val_local;
  char *list_local;
  
  if ((list == (char *)0x0) || (*list == '\0')) {
    val_local = (mg_str *)0x0;
  }
  else {
    val->p = list;
    pcVar1 = strchr(val->p,0x2c);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = val->p;
      sVar2 = strlen(val->p);
      val_local = (mg_str *)(pcVar1 + sVar2);
      val->len = (long)val_local - (long)val->p;
    }
    else {
      val->len = (long)pcVar1 - (long)val->p;
      val_local = (mg_str *)(pcVar1 + 1);
    }
    if (eq_val != (mg_str *)0x0) {
      eq_val->len = 0;
      pcVar1 = (char *)memchr(val->p,0x3d,val->len);
      eq_val->p = pcVar1;
      if (eq_val->p != (char *)0x0) {
        eq_val->p = eq_val->p + 1;
        eq_val->len = (size_t)(val->p + (val->len - (long)eq_val->p));
        val->len = (size_t)(eq_val->p + (-1 - (long)val->p));
      }
    }
  }
  return (char *)val_local;
}

Assistant:

const char *mg_next_comma_list_entry(const char *list, struct mg_str *val,
                                     struct mg_str *eq_val) {
    if (list == NULL || *list == '\0') {
        /* End of the list */
        list = NULL;
    } else {
        val->p = list;
        if ((list = strchr(val->p, ',')) != NULL) {
            /* Comma found. Store length and shift the list ptr */
            val->len = list - val->p;
            list++;
        } else {
            /* This value is the last one */
            list = val->p + strlen(val->p);
            val->len = list - val->p;
        }

        if (eq_val != NULL) {
            /* Value has form "x=y", adjust pointers and lengths */
            /* so that val points to "x", and eq_val points to "y". */
            eq_val->len = 0;
            eq_val->p = (const char *) memchr(val->p, '=', val->len);
            if (eq_val->p != NULL) {
                eq_val->p++; /* Skip over '=' character */
                eq_val->len = val->p + val->len - eq_val->p;
                val->len = (eq_val->p - val->p) - 1;
            }
        }
    }

    return list;
}